

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitting_filter.c
# Opt level: O0

void WebRtcSpl_AnalysisQMF
               (int16_t *in_data,size_t in_data_length,int16_t *low_band,int16_t *high_band,
               int32_t *filter_state1,int32_t *filter_state2)

{
  int16_t iVar1;
  ulong data_length;
  size_t band_length;
  int32_t filter2 [320];
  int32_t filter1 [320];
  int32_t half_in2 [320];
  int32_t half_in1 [320];
  int32_t tmp;
  int16_t k;
  size_t i;
  int32_t *filter_state2_local;
  int32_t *filter_state1_local;
  int16_t *high_band_local;
  int16_t *low_band_local;
  size_t in_data_length_local;
  int16_t *in_data_local;
  
  data_length = in_data_length >> 1;
  if ((in_data_length & 1) != 0) {
    __assert_fail("in_data_length % 2 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/signal_processing/splitting_filter.c"
                  ,0x8b,
                  "void WebRtcSpl_AnalysisQMF(const int16_t *, size_t, int16_t *, int16_t *, int32_t *, int32_t *)"
                 );
  }
  if (data_length < 0x141) {
    half_in1[0x13f]._2_2_ = 0;
    for (_tmp = 0; _tmp < data_length; _tmp = _tmp + 1) {
      filter1[_tmp + 0x13e] = (int)in_data[half_in1[0x13f]._2_2_] << 10;
      half_in2[_tmp + 0x13e] = (int)in_data[half_in1[0x13f]._2_2_ + 1] << 10;
      half_in1[0x13f]._2_2_ = half_in1[0x13f]._2_2_ + 2;
    }
    WebRtcSpl_AllPassQMF
              (half_in2 + 0x13e,data_length,filter2 + 0x13e,WebRtcSpl_kAllPassFilter1,filter_state1)
    ;
    WebRtcSpl_AllPassQMF
              (filter1 + 0x13e,data_length,(int32_t *)&band_length,WebRtcSpl_kAllPassFilter2,
               filter_state2);
    for (_tmp = 0; _tmp < data_length; _tmp = _tmp + 1) {
      iVar1 = WebRtcSpl_SatW32ToW16(filter2[_tmp + 0x13e] + filter2[_tmp - 2] + 0x400 >> 0xb);
      low_band[_tmp] = iVar1;
      iVar1 = WebRtcSpl_SatW32ToW16((filter2[_tmp + 0x13e] - filter2[_tmp - 2]) + 0x400 >> 0xb);
      high_band[_tmp] = iVar1;
    }
    return;
  }
  __assert_fail("band_length <= kMaxBandFrameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/signal_processing/splitting_filter.c"
                ,0x8c,
                "void WebRtcSpl_AnalysisQMF(const int16_t *, size_t, int16_t *, int16_t *, int32_t *, int32_t *)"
               );
}

Assistant:

void WebRtcSpl_AnalysisQMF(const int16_t* in_data, size_t in_data_length,
                           int16_t* low_band, int16_t* high_band,
                           int32_t* filter_state1, int32_t* filter_state2)
{
    size_t i;
    int16_t k;
    int32_t tmp;
    int32_t half_in1[kMaxBandFrameLength];
    int32_t half_in2[kMaxBandFrameLength];
    int32_t filter1[kMaxBandFrameLength];
    int32_t filter2[kMaxBandFrameLength];
    const size_t band_length = in_data_length / 2;
    assert(in_data_length % 2 == 0);
    assert(band_length <= kMaxBandFrameLength);

    // Split even and odd samples. Also shift them to Q10.
    for (i = 0, k = 0; i < band_length; i++, k += 2)
    {
        half_in2[i] = WEBRTC_SPL_LSHIFT_W32((int32_t)in_data[k], 10);
        half_in1[i] = WEBRTC_SPL_LSHIFT_W32((int32_t)in_data[k + 1], 10);
    }

    // All pass filter even and odd samples, independently.
    WebRtcSpl_AllPassQMF(half_in1, band_length, filter1,
                         WebRtcSpl_kAllPassFilter1, filter_state1);
    WebRtcSpl_AllPassQMF(half_in2, band_length, filter2,
                         WebRtcSpl_kAllPassFilter2, filter_state2);

    // Take the sum and difference of filtered version of odd and even
    // branches to get upper & lower band.
    for (i = 0; i < band_length; i++)
    {
        tmp = (filter1[i] + filter2[i] + 1024) >> 11;
        low_band[i] = WebRtcSpl_SatW32ToW16(tmp);

        tmp = (filter1[i] - filter2[i] + 1024) >> 11;
        high_band[i] = WebRtcSpl_SatW32ToW16(tmp);
    }
}